

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
          (Geometry<std::allocator<unsigned_long>_> *this,size_t dimension)

{
  unsigned_long *puVar1;
  size_t *psVar2;
  size_t *psVar3;
  size_t *psVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  runtime_error *this_00;
  ulong uVar7;
  ulong uVar8;
  
  if (this->dimension_ != dimension) {
    puVar5 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                       ((new_allocator<unsigned_long> *)this,dimension * 3,(void *)0x0);
    puVar1 = puVar5 + dimension;
    uVar8 = this->dimension_;
    sVar6 = dimension;
    if (uVar8 < dimension) {
      sVar6 = uVar8;
    }
    if (sVar6 != 0) {
      psVar2 = this->shape_;
      psVar3 = this->shapeStrides_;
      psVar4 = this->strides_;
      uVar7 = 0;
      do {
        puVar5[uVar7] = psVar2[uVar7];
        if (this->dimension_ <= uVar7) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0010834e:
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar1[uVar7] = psVar3[uVar7];
        if (this->dimension_ <= uVar7) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_0010834e;
        }
        (puVar1 + dimension)[uVar7] = psVar4[uVar7];
        uVar7 = uVar7 + 1;
        uVar8 = this->dimension_;
        sVar6 = dimension;
        if (uVar8 < dimension) {
          sVar6 = uVar8;
        }
      } while (uVar7 < sVar6);
    }
    operator_delete(this->shape_,uVar8 * 0x18);
    this->shape_ = puVar5;
    this->shapeStrides_ = puVar1;
    this->strides_ = puVar1 + dimension;
    this->dimension_ = dimension;
  }
  return;
}

Assistant:

inline void 
Geometry<A>::resize
(
    const std::size_t dimension
)
{
    if(dimension != dimension_) {
        std::size_t* newShape = allocator_.allocate(dimension*3);
        std::size_t* newShapeStrides = newShape + dimension;
        std::size_t* newStrides = newShapeStrides + dimension; 
        for(std::size_t j=0; j<( (dimension < dimension_) ? dimension : dimension_); ++j) {
            // save existing entries
            newShape[j] = shape(j);
            newShapeStrides[j] = shapeStrides(j);
            newStrides[j] = strides(j);
        }
        allocator_.deallocate(shape_, dimension_*3);
        shape_ = newShape;
        shapeStrides_ = newShapeStrides;
        strides_ = newStrides;
        dimension_ = dimension;
    }
}